

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O2

int pospopcnt_u16_avx2_lemire2(uint16_t *array,uint32_t len,uint32_t *flags)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  size_t i;
  long lVar4;
  ulong uVar5;
  size_t i_1;
  size_t k_1;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  uint16_t auVar10 [16];
  undefined1 auVar11 [64];
  uint16_t buffer [16];
  
  auVar3 = _DAT_0010fa20;
  if (len < 0x40) {
    pospopcnt_u16_scalar_naive(array,len,flags);
  }
  else {
    auVar11 = ZEXT1664((undefined1  [16])0x0);
    auVar10 = auVar11._0_32_;
    buffer[0] = auVar10[0];
    buffer[1] = auVar10[1];
    buffer[2] = auVar10[2];
    buffer[3] = auVar10[3];
    buffer[4] = auVar10[4];
    buffer[5] = auVar10[5];
    buffer[6] = auVar10[6];
    buffer[7] = auVar10[7];
    buffer[8] = auVar10[8];
    buffer[9] = auVar10[9];
    buffer[10] = auVar10[10];
    buffer[0xb] = auVar10[0xb];
    buffer[0xc] = auVar10[0xc];
    buffer[0xd] = auVar10[0xd];
    buffer[0xe] = auVar10[0xe];
    buffer[0xf] = auVar10[0xf];
    lVar4 = 1;
    while (lVar4 != 0x10) {
      auVar1 = vpand_avx2(_DAT_0010fa20,*(undefined1 (*) [32])(buffer + lVar4));
      lVar4 = lVar4 + 1;
      auVar1 = vpcmpeqw_avx2(auVar1,_DAT_0010fa20);
      auVar1 = vpsubw_avx2(auVar11._0_32_,auVar1);
      auVar11 = ZEXT3264(auVar1);
    }
    uVar5 = (ulong)len;
    buffer = *(uint16_t (*) [16])(array + (uVar5 - 0x10));
    lVar4 = 1;
    while (auVar10 = auVar11._0_32_, lVar4 != 0x10) {
      auVar1 = vpand_avx2(_DAT_0010fa20,*(undefined1 (*) [32])(buffer + lVar4));
      lVar4 = lVar4 + 1;
      auVar1 = vpcmpeqw_avx2(auVar1,_DAT_0010fa20);
      auVar1 = vpsubw_avx2((undefined1  [32])auVar10,auVar1);
      auVar11 = ZEXT3264(auVar1);
    }
    buffer[0] = auVar10[0];
    buffer[1] = auVar10[1];
    buffer[2] = auVar10[2];
    buffer[3] = auVar10[3];
    buffer[4] = auVar10[4];
    buffer[5] = auVar10[5];
    buffer[6] = auVar10[6];
    buffer[7] = auVar10[7];
    buffer[8] = auVar10[8];
    buffer[9] = auVar10[9];
    buffer[10] = auVar10[10];
    buffer[0xb] = auVar10[0xb];
    buffer[0xc] = auVar10[0xc];
    buffer[0xd] = auVar10[0xd];
    buffer[0xe] = auVar10[0xe];
    buffer[0xf] = auVar10[0xf];
    for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
      flags[lVar4] = flags[lVar4] + (uint)buffer[lVar4];
    }
    for (lVar4 = 0; lVar4 + 0x10U <= uVar5; lVar4 = lVar4 + uVar8) {
      uVar8 = (uVar5 - 0xf) - lVar4;
      if (lVar4 + 0x1000fU < uVar5) {
        uVar8 = 0xffff;
      }
      if (uVar8 < 9) {
        auVar11 = ZEXT1664((undefined1  [16])0x0);
        uVar6 = 0;
      }
      else {
        uVar6 = uVar8 & 0xfffffffffffffff8;
        auVar11 = ZEXT1664((undefined1  [16])0x0);
        uVar9 = 0;
        while (uVar9 < uVar8 - 7) {
          auVar1 = vpand_avx2(auVar3,*(undefined1 (*) [32])(array + lVar4 + uVar9));
          auVar1 = vpcmpeqw_avx2(auVar1,auVar3);
          auVar2 = vpsubw_avx2(auVar11._0_32_,auVar1);
          auVar1 = vpand_avx2(auVar3,*(undefined1 (*) [32])(array + lVar4 + uVar9 + 1));
          auVar1 = vpcmpeqw_avx2(auVar1,auVar3);
          auVar2 = vpsubw_avx2(auVar2,auVar1);
          auVar1 = vpand_avx2(auVar3,*(undefined1 (*) [32])(array + lVar4 + uVar9 + 2));
          auVar1 = vpcmpeqw_avx2(auVar1,auVar3);
          auVar2 = vpsubw_avx2(auVar2,auVar1);
          auVar1 = vpand_avx2(auVar3,*(undefined1 (*) [32])(array + lVar4 + uVar9 + 3));
          auVar1 = vpcmpeqw_avx2(auVar1,auVar3);
          auVar2 = vpsubw_avx2(auVar2,auVar1);
          auVar1 = vpand_avx2(auVar3,*(undefined1 (*) [32])(array + lVar4 + uVar9 + 4));
          auVar1 = vpcmpeqw_avx2(auVar1,auVar3);
          auVar2 = vpsubw_avx2(auVar2,auVar1);
          auVar1 = vpand_avx2(auVar3,*(undefined1 (*) [32])(array + lVar4 + uVar9 + 5));
          auVar1 = vpcmpeqw_avx2(auVar1,auVar3);
          auVar2 = vpsubw_avx2(auVar2,auVar1);
          auVar1 = vpand_avx2(auVar3,*(undefined1 (*) [32])(array + lVar4 + uVar9 + 6));
          auVar1 = vpcmpeqw_avx2(auVar1,auVar3);
          auVar2 = vpsubw_avx2(auVar2,auVar1);
          auVar1 = vpand_avx2(auVar3,*(undefined1 (*) [32])(array + lVar4 + uVar9 + 7));
          uVar9 = uVar9 + 8;
          auVar1 = vpcmpeqw_avx2(auVar1,auVar3);
          auVar1 = vpsubw_avx2(auVar2,auVar1);
          auVar11 = ZEXT3264(auVar1);
        }
      }
      if (4 < uVar8) {
        while (uVar6 + 3 < uVar8) {
          auVar1 = vpand_avx2(auVar3,*(undefined1 (*) [32])(array + lVar4 + uVar6));
          auVar1 = vpcmpeqw_avx2(auVar1,auVar3);
          auVar2 = vpsubw_avx2(auVar11._0_32_,auVar1);
          auVar1 = vpand_avx2(auVar3,*(undefined1 (*) [32])(array + lVar4 + uVar6 + 1));
          auVar1 = vpcmpeqw_avx2(auVar1,auVar3);
          auVar2 = vpsubw_avx2(auVar2,auVar1);
          auVar1 = vpand_avx2(auVar3,*(undefined1 (*) [32])(array + lVar4 + uVar6 + 2));
          auVar1 = vpcmpeqw_avx2(auVar1,auVar3);
          auVar2 = vpsubw_avx2(auVar2,auVar1);
          auVar1 = vpand_avx2(auVar3,*(undefined1 (*) [32])(array + lVar4 + uVar6 + 3));
          uVar6 = uVar6 + 4;
          auVar1 = vpcmpeqw_avx2(auVar1,auVar3);
          auVar1 = vpsubw_avx2(auVar2,auVar1);
          auVar11 = ZEXT3264(auVar1);
        }
      }
      if (uVar8 <= uVar6) {
        uVar8 = uVar6;
      }
      while (auVar10 = auVar11._0_32_, uVar8 != uVar6) {
        auVar1 = vpand_avx2(auVar3,*(undefined1 (*) [32])(array + lVar4 + uVar6));
        uVar6 = uVar6 + 1;
        auVar1 = vpcmpeqw_avx2(auVar1,auVar3);
        auVar1 = vpsubw_avx2((undefined1  [32])auVar10,auVar1);
        auVar11 = ZEXT3264(auVar1);
      }
      buffer[0] = auVar10[0];
      buffer[1] = auVar10[1];
      buffer[2] = auVar10[2];
      buffer[3] = auVar10[3];
      buffer[4] = auVar10[4];
      buffer[5] = auVar10[5];
      buffer[6] = auVar10[6];
      buffer[7] = auVar10[7];
      buffer[8] = auVar10[8];
      buffer[9] = auVar10[9];
      buffer[10] = auVar10[10];
      buffer[0xb] = auVar10[0xb];
      buffer[0xc] = auVar10[0xc];
      buffer[0xd] = auVar10[0xd];
      buffer[0xe] = auVar10[0xe];
      buffer[0xf] = auVar10[0xf];
      for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 1) {
        flags[lVar7] = flags[lVar7] + (uint)buffer[lVar7];
      }
    }
  }
  return 0;
}

Assistant:

int pospopcnt_u16_avx2_lemire2(const uint16_t* array, uint32_t len, uint32_t* flags) {
    uint16_t buffer[16];
    __m256i bits = _mm256_set_epi16(-32768, 16384, 8192, 4096, 2048, 1024, 512, 256, 
                                       128,    64,   32,   16,    8,    4,   2,   1);
    // we do the first part
    if (len < 64) {
        // don't bother with handcrafted SIMD
        pospopcnt_u16_scalar_naive(array, len, flags);
        return 0;
    }
    // handle the start (naively)
    __m256i count16 = _mm256_setzero_si256();

    {
        uint16_t startbuffer[32];
        memset(startbuffer, 0, 32 * 2);
        memcpy(startbuffer + 16, array, 16 * 2);
        for (size_t i = 1; i < 16; ++i) {
            __m256i input = _mm256_loadu_si256((__m256i*)(startbuffer + i));
            __m256i m  = _mm256_and_si256(input, bits);
            __m256i eq = _mm256_cmpeq_epi16(bits, m);
            count16 = _mm256_sub_epi16(count16, eq);
        }
    }

    {
        uint16_t startbuffer[32];
        memset(startbuffer, 0, 32 * 2);
        memcpy(startbuffer, array + len - 16, 16 * 2);
        for (size_t i = 1; i < 16; ++i) {
            __m256i input = _mm256_loadu_si256((__m256i*)(startbuffer + i));
            __m256i m  = _mm256_and_si256(input, bits);
            __m256i eq = _mm256_cmpeq_epi16(bits, m);
            count16 = _mm256_sub_epi16(count16, eq);
        }
    }

    _mm256_storeu_si256((__m256i*)buffer, count16);
    for (size_t k = 0; k < 16; k++) {
        flags[k] += buffer[k];
    }

    // main loop starts here
    for (size_t i = 0; i + 16 <= len;) {
        count16 = _mm256_setzero_si256();
        size_t j = 0;
        size_t maxj = 65535;

        if (maxj + i + 16 >= len)
            maxj = len - i - 15;

        if (maxj > 8) {
            for (/**/; j < maxj - 7; j += 8) {
                __m256i input1 = _mm256_loadu_si256((__m256i*)(array + i + j));
                __m256i m1  = _mm256_and_si256(input1, bits);
                __m256i eq1 = _mm256_cmpeq_epi16(bits, m1);
                count16 = _mm256_sub_epi16(count16, eq1);
                __m256i input2 = _mm256_loadu_si256((__m256i*)(array + i + j + 1));
                __m256i m2  = _mm256_and_si256(input2, bits);
                __m256i eq2 = _mm256_cmpeq_epi16(bits, m2);
                count16 = _mm256_sub_epi16(count16, eq2);
                __m256i input3 = _mm256_loadu_si256((__m256i*)(array + i + j + 2));
                __m256i m3  = _mm256_and_si256(input3, bits);
                __m256i eq3 = _mm256_cmpeq_epi16(bits, m3);
                count16 = _mm256_sub_epi16(count16, eq3);
                __m256i input4 = _mm256_loadu_si256((__m256i*)(array + i + j + 3));
                __m256i m4  = _mm256_and_si256(input4, bits);
                __m256i eq4 = _mm256_cmpeq_epi16(bits, m4);
                count16 = _mm256_sub_epi16(count16, eq4);
                __m256i input5 = _mm256_loadu_si256((__m256i*)(array + i + j + 4));
                __m256i m5  = _mm256_and_si256(input5, bits);
                __m256i eq5 = _mm256_cmpeq_epi16(bits, m5);
                count16 = _mm256_sub_epi16(count16, eq5);
                __m256i input6 = _mm256_loadu_si256((__m256i*)(array + i + j + 5));
                __m256i m6  = _mm256_and_si256(input6, bits);
                __m256i eq6 = _mm256_cmpeq_epi16(bits, m6);
                count16 = _mm256_sub_epi16(count16, eq6);
                __m256i input7 = _mm256_loadu_si256((__m256i*)(array + i + j + 6));
                __m256i m7  = _mm256_and_si256(input7, bits);
                __m256i eq7 = _mm256_cmpeq_epi16(bits, m7);
                count16 = _mm256_sub_epi16(count16, eq7);
                __m256i input8 = _mm256_loadu_si256((__m256i*)(array + i + j + 7));
                __m256i m8  = _mm256_and_si256(input8, bits);
                __m256i eq8 = _mm256_cmpeq_epi16(bits, m8);
                count16 = _mm256_sub_epi16(count16, eq8);
            }
        }

        if (maxj > 4) {
            for (/**/; j + 3 < maxj; j += 4) {
                __m256i input1 = _mm256_loadu_si256((__m256i*)(array + i + j));
                __m256i m1  = _mm256_and_si256(input1, bits);
                __m256i eq1 = _mm256_cmpeq_epi16(bits, m1);
                count16 = _mm256_sub_epi16(count16, eq1);
                __m256i input2 = _mm256_loadu_si256((__m256i*)(array + i + j + 1));
                __m256i m2  = _mm256_and_si256(input2, bits);
                __m256i eq2 = _mm256_cmpeq_epi16(bits, m2);
                count16 = _mm256_sub_epi16(count16, eq2);
                __m256i input3 = _mm256_loadu_si256((__m256i*)(array + i + j + 2));
                __m256i m3  = _mm256_and_si256(input3, bits);
                __m256i eq3 = _mm256_cmpeq_epi16(bits, m3);
                count16 = _mm256_sub_epi16(count16, eq3);
                __m256i input4 = _mm256_loadu_si256((__m256i*)(array + i + j + 3));
                __m256i m4  = _mm256_and_si256(input4, bits);
                __m256i eq4 = _mm256_cmpeq_epi16(bits, m4);
                count16 = _mm256_sub_epi16(count16, eq4);
            }
        }
        for (/**/; j < maxj; ++j) {
            __m256i input = _mm256_loadu_si256((__m256i*)(array + i + j));
            __m256i m  = _mm256_and_si256(input, bits);
            __m256i eq = _mm256_cmpeq_epi16(bits, m);
            count16 = _mm256_sub_epi16(count16, eq);
        }
        i += j;

        _mm256_storeu_si256((__m256i*)buffer, count16);
        for (size_t k = 0; k < 16; k++) {
            flags[k] += buffer[k];
        }
    }
    return 0;
}